

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

void __thiscall
t_rs_generator::render_union_impl(t_rs_generator *this,string *union_name,t_struct *tstruct)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  ostream *poVar3;
  
  poVar1 = &this->f_gen_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"impl ",5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(union_name->_M_dataplus)._M_p,union_name->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  render_union_sync_read(this,union_name,tstruct);
  render_union_sync_write(this,union_name,tstruct);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  return;
}

Assistant:

void t_rs_generator::render_union_impl(const string& union_name, t_struct* tstruct) {
  f_gen_ << "impl " << union_name << " {" << endl;
  indent_up();

  render_union_sync_read(union_name, tstruct);
  render_union_sync_write(union_name, tstruct);

  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}